

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  uchar *puVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  uchar *ptr_5;
  int j_1;
  Mat m;
  uchar *outptr_5;
  int p_1;
  Mat *top_blob_5;
  int slice_5;
  size_t i_5;
  int q_5;
  int channels_2;
  int h_4;
  int w_5;
  uchar *ptr_4;
  uchar *outptr_4;
  int size_2;
  int p;
  Mat *top_blob_4;
  int slice_4;
  size_t i_4;
  int q_4;
  int channels_1;
  int h_3;
  int w_4;
  uchar *outptr_3;
  uchar *ptr_3;
  int size_1;
  Mat *top_blob_3;
  int slice_3;
  size_t i_3;
  int q_3;
  int channels;
  int h_2;
  int w_3;
  uchar *ptr_2;
  uchar *outptr_2;
  int j;
  Mat *top_blob_2;
  int slice_2;
  size_t i_2;
  int q_2;
  int h_1;
  int w_2;
  uchar *outptr_1;
  uchar *ptr_1;
  int size;
  Mat *top_blob_1;
  int slice_1;
  size_t i_1;
  int q_1;
  int h;
  int w_1;
  uchar *outptr;
  uchar *ptr;
  Mat *top_blob;
  int slice;
  size_t i;
  int q;
  int w;
  int positive_axis;
  int *slices_ptr;
  size_t elemsize;
  int dims;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffffc10;
  Allocator *in_stack_fffffffffffffc18;
  ulong in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  ulong uVar5;
  Mat *in_stack_fffffffffffffc30;
  Mat *in_stack_fffffffffffffc38;
  int local_34c;
  int local_334;
  Mat local_330;
  Mat local_2e8;
  Allocator *local_2a0;
  int local_294;
  reference local_290;
  int local_284;
  ulong local_280;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  Mat local_268;
  Mat *local_220;
  Mat local_218;
  uchar *local_1d0;
  int local_1c8;
  int local_1c4;
  reference local_1c0;
  int local_1b4;
  ulong local_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  uchar *local_198;
  Mat local_180;
  uchar *local_138;
  int local_12c;
  reference local_128;
  int local_11c;
  ulong local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  uchar *local_100;
  uchar *local_f8;
  int local_ec;
  reference local_e8;
  int local_dc;
  ulong local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  uchar *local_c0;
  uchar *local_b8;
  int local_ac;
  reference local_a8;
  int local_9c;
  ulong local_98;
  int local_8c;
  int local_88;
  int local_84;
  uchar *local_80;
  uchar *local_78;
  reference local_70;
  int local_64;
  ulong local_60;
  int local_54;
  int local_50;
  int local_4c;
  int *local_48;
  size_t local_40;
  int local_34;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  
  local_20 = in_RDX;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->dims;
  local_40 = local_30->elemsize;
  local_48 = ncnn::Mat::operator_cast_to_int_((Mat *)(in_RDI + 0xd0));
  if (*(int *)(in_RDI + 0x118) < 0) {
    local_34c = local_34 + *(int *)(in_RDI + 0x118);
  }
  else {
    local_34c = *(int *)(in_RDI + 0x118);
  }
  local_4c = local_34c;
  if (local_34 == 1) {
    local_50 = local_30->w;
    local_54 = 0;
    for (local_60 = 0; uVar5 = local_60,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar5 < sVar3;
        local_60 = local_60 + 1) {
      local_64 = local_48[local_60];
      if (local_64 == -0xe9) {
        iVar2 = local_50 - local_54;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_64 = (int)((ulong)(long)iVar2 / (sVar3 - local_60));
      }
      local_70 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_60);
      ncnn::Mat::create(in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                        in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffc10);
      if (bVar1) {
        return -100;
      }
      local_78 = ncnn::Mat::operator_cast_to_unsigned_char_(local_30);
      local_78 = local_78 + (long)local_54 * local_40;
      local_80 = ncnn::Mat::operator_cast_to_unsigned_char_(local_70);
      memcpy(local_80,local_78,(long)local_64 * local_40);
      local_54 = local_64 + local_54;
    }
  }
  else if ((local_34 == 2) && (local_34c == 0)) {
    local_84 = local_30->w;
    local_88 = local_30->h;
    local_8c = 0;
    for (local_98 = 0; uVar5 = local_98,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar5 < sVar3;
        local_98 = local_98 + 1) {
      local_9c = local_48[local_98];
      if (local_9c == -0xe9) {
        iVar2 = local_88 - local_8c;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_9c = (int)((ulong)(long)iVar2 / (sVar3 - local_98));
      }
      local_a8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_98);
      ncnn::Mat::create(in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                        (int)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                        in_stack_fffffffffffffc18);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffc10);
      if (bVar1) {
        return -100;
      }
      local_ac = local_84 * local_9c;
      local_b8 = ncnn::Mat::row<unsigned_char_const>(local_30,local_8c);
      local_c0 = ncnn::Mat::operator_cast_to_unsigned_char_(local_a8);
      memcpy(local_c0,local_b8,(long)local_ac * local_40);
      local_8c = local_9c + local_8c;
    }
  }
  else if ((local_34 == 2) && (local_34c == 1)) {
    local_c4 = local_30->w;
    local_c8 = local_30->h;
    local_cc = 0;
    for (local_d8 = 0; uVar5 = local_d8,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar5 < sVar3;
        local_d8 = local_d8 + 1) {
      local_dc = local_48[local_d8];
      if (local_dc == -0xe9) {
        iVar2 = local_c4 - local_cc;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_dc = (int)((ulong)(long)iVar2 / (sVar3 - local_d8));
      }
      local_e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_d8);
      ncnn::Mat::create(in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                        (int)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                        in_stack_fffffffffffffc18);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffc10);
      if (bVar1) {
        return -100;
      }
      for (local_ec = 0; local_ec < local_c8; local_ec = local_ec + 1) {
        local_f8 = ncnn::Mat::row<unsigned_char>(local_e8,local_ec);
        local_100 = ncnn::Mat::row<unsigned_char_const>(local_30,local_ec);
        local_100 = local_100 + (long)local_cc * local_40;
        memcpy(local_f8,local_100,(long)local_dc * local_40);
      }
      local_cc = local_dc + local_cc;
    }
  }
  else if ((local_34 == 3) && (local_34c == 0)) {
    local_104 = local_30->w;
    local_108 = local_30->h;
    local_10c = local_30->c;
    local_110 = 0;
    for (local_118 = 0; uVar5 = local_118,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar5 < sVar3;
        local_118 = local_118 + 1) {
      local_11c = local_48[local_118];
      if (local_11c == -0xe9) {
        iVar2 = local_10c - local_110;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_11c = (int)((ulong)(long)iVar2 / (sVar3 - local_118));
      }
      local_128 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_118)
      ;
      ncnn::Mat::create(in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                        (int)in_stack_fffffffffffffc28,(int)(in_stack_fffffffffffffc20 >> 0x20),
                        (size_t)in_stack_fffffffffffffc18,(Allocator *)in_stack_fffffffffffffc10);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffc10);
      if (bVar1) {
        return -100;
      }
      local_12c = (int)local_30->cstep * local_11c;
      ncnn::Mat::channel(in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
      puVar4 = ncnn::Mat::operator_cast_to_unsigned_char_(&local_180);
      ncnn::Mat::~Mat((Mat *)0x50dfac);
      local_138 = puVar4;
      local_198 = ncnn::Mat::operator_cast_to_unsigned_char_(local_128);
      memcpy(local_198,local_138,(long)local_12c * local_40);
      local_110 = local_11c + local_110;
    }
  }
  else if ((local_34 == 3) && (local_34c == 1)) {
    local_19c = local_30->w;
    local_1a0 = local_30->h;
    local_1a4 = local_30->c;
    local_1a8 = 0;
    for (local_1b0 = 0; uVar5 = local_1b0,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar5 < sVar3;
        local_1b0 = local_1b0 + 1) {
      local_1b4 = local_48[local_1b0];
      if (local_1b4 == -0xe9) {
        iVar2 = local_1a0 - local_1a8;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_1b4 = (int)((ulong)(long)iVar2 / (sVar3 - local_1b0));
      }
      local_1c0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_1b0)
      ;
      ncnn::Mat::create(in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                        (int)in_stack_fffffffffffffc28,(int)(in_stack_fffffffffffffc20 >> 0x20),
                        (size_t)in_stack_fffffffffffffc18,(Allocator *)in_stack_fffffffffffffc10);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffc10);
      if (bVar1) {
        return -100;
      }
      for (local_1c4 = 0; local_1c4 < local_1a4; local_1c4 = local_1c4 + 1) {
        local_1c8 = local_19c * local_1b4;
        ncnn::Mat::channel(in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20)
                          );
        puVar4 = ncnn::Mat::operator_cast_to_unsigned_char_(&local_218);
        ncnn::Mat::~Mat((Mat *)0x50e23d);
        in_stack_fffffffffffffc30 = &local_268;
        local_1d0 = puVar4;
        ncnn::Mat::channel(in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20)
                          );
        in_stack_fffffffffffffc38 =
             (Mat *)ncnn::Mat::row<unsigned_char_const>(in_stack_fffffffffffffc30,local_1a8);
        ncnn::Mat::~Mat((Mat *)0x50e290);
        local_220 = in_stack_fffffffffffffc38;
        memcpy(local_1d0,in_stack_fffffffffffffc38,(long)local_1c8 * local_40);
      }
      local_1a8 = local_1b4 + local_1a8;
    }
  }
  else if ((local_34 == 3) && (local_34c == 2)) {
    local_26c = local_30->w;
    local_270 = local_30->h;
    local_274 = local_30->c;
    local_278 = 0;
    local_280 = 0;
    while (uVar5 = local_280,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar5 < sVar3)
    {
      local_284 = local_48[local_280];
      if (local_284 == -0xe9) {
        in_stack_fffffffffffffc20 = (ulong)(local_26c - local_278);
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_284 = (int)(in_stack_fffffffffffffc20 / (sVar3 - local_280));
      }
      local_290 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_280)
      ;
      ncnn::Mat::create(in_stack_fffffffffffffc30,(int)(uVar5 >> 0x20),(int)uVar5,
                        (int)(in_stack_fffffffffffffc20 >> 0x20),(size_t)in_stack_fffffffffffffc18,
                        (Allocator *)in_stack_fffffffffffffc10);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffc10);
      if (bVar1) {
        return -100;
      }
      for (local_294 = 0; local_294 < local_274; local_294 = local_294 + 1) {
        in_stack_fffffffffffffc10 = &local_2e8;
        ncnn::Mat::channel(in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20)
                          );
        in_stack_fffffffffffffc18 =
             (Allocator *)ncnn::Mat::operator_cast_to_unsigned_char_(in_stack_fffffffffffffc10);
        ncnn::Mat::~Mat((Mat *)0x50e530);
        local_2a0 = in_stack_fffffffffffffc18;
        ncnn::Mat::channel(in_stack_fffffffffffffc38,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20)
                          );
        for (local_334 = 0; local_334 < local_270; local_334 = local_334 + 1) {
          puVar4 = ncnn::Mat::row<unsigned_char_const>(&local_330,local_334);
          memcpy(local_2a0,puVar4 + (long)local_278 * local_40,(long)local_284 * local_40);
          local_2a0 = (Allocator *)((long)&local_2a0->_vptr_Allocator + (long)local_284 * local_40);
        }
        ncnn::Mat::~Mat((Mat *)0x50e665);
      }
      local_278 = local_284 + local_278;
      local_280 = local_280 + 1;
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).row<const unsigned char>(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < h; j++)
                {
                    const unsigned char* ptr = m.row<const unsigned char>(j) + q * elemsize;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice * elemsize;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}